

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

int __thiscall
CVmObjFileName::getp_getFileInfo(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  void *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  vm_datatype_t vVar6;
  uint uVar7;
  undefined4 uVar8;
  CVmNetFile *this_00;
  size_t srclen;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long *in_FS_OFFSET;
  os_file_stat_t stat;
  vm_rcdesc rc;
  err_frame_t err_cur__;
  os_file_stat_t local_10b0;
  vm_rcdesc local_1080;
  uint local_1038 [2];
  long local_1030;
  void *local_1028;
  __jmp_buf_tag local_1020 [20];
  
  if (oargc == (uint *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *oargc;
  }
  if (getp_getFileInfo(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getFileInfo();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getFileInfo::desc);
  if (iVar4 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&local_1080,(EVP_PKEY_CTX *)"FileName.getFileInfo");
    uVar11 = 0xb;
    this_00 = CVmObjFile::get_filename_from_obj
                        (self,&local_1080,0x1001,0xb,"application/octet-stream");
    if (uVar10 == 0) {
      uVar7 = 1;
    }
    else {
      vVar6 = sp_[-1].typ;
      uVar11 = (uint)(vVar6 == VM_TRUE);
      if (vVar6 - VM_STACK < 0xfffffffe) {
        err_throw(0x902);
      }
      uVar7 = (uint)(vVar6 == VM_TRUE);
    }
    G_err_frame::__tls_init();
    local_1030 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_1038;
    local_1038[0] = _setjmp(local_1020);
    if (local_1038[0] == 0) {
      iVar4 = CVmNetFile::get_file_stat(this_00,&local_10b0,uVar7);
      uVar11 = (uint)(iVar4 == 0);
    }
    if (-1 < (short)local_1038[0]) {
      local_1038[0] = local_1038[0] | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    lVar9 = local_1030;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar9;
    if ((local_1038[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar3 = local_1028;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_1038[0] & 2) != 0) {
      free(local_1028);
    }
    pvVar2 = sp_;
    if ((uVar11 & 1) == 0) {
      uVar13 = 0;
      uVar12 = uVar13;
      do {
        uVar11 = (uint)uVar12;
        if ((*(ulong *)((long)&map_file_attrs(unsigned_long)::xlat + uVar13) & local_10b0.attrs) !=
            0) {
          uVar11 = uVar11 | *(uint *)((long)&DAT_003036a8 + uVar13);
        }
        uVar13 = uVar13 + 0x10;
        uVar12 = (ulong)uVar11;
      } while (uVar13 != 0x40);
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_INT;
      (pvVar2->val).obj = uVar11;
      if ((((uint)local_10b0.mode & 0xa000) == 0) ||
         (iVar4 = CVmNetFile::resolve_symlink(this_00,(char *)local_1038,0x1000), pvVar2 = sp_,
         iVar4 == 0)) {
        pvVar1 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar1 = VM_NIL;
      }
      else {
        sp_ = sp_ + 1;
        srclen = strlen((char *)local_1038);
        vVar5 = CVmObjString::create(0,(char *)local_1038,srclen,G_cmap_from_fname_X);
        pvVar2->typ = VM_OBJ;
        (pvVar2->val).obj = vVar5;
      }
      push_file_time(local_10b0.acc_time);
      push_file_time(local_10b0.mod_time);
      push_file_time(local_10b0.cre_time);
      vVar6 = VM_INT;
      if ((int)local_10b0.sizelo < 0 || local_10b0.sizehi != 0) {
        local_10b0.sizelo = CVmObjBigNum::create_int64(0,local_10b0.sizehi,local_10b0.sizelo);
        vVar6 = VM_OBJ;
      }
      pvVar2 = sp_;
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = vVar6;
      (pvVar2->val).enumval = local_10b0.sizelo;
      uVar11 = 0;
      lVar9 = 8;
      do {
        if ((*(ulong *)(&UNK_00303628 + lVar9) & (long)(int)(uint)local_10b0.mode) != 0) {
          uVar11 = uVar11 | *(uint *)((long)&filemode_to_filetype(int)::xlat + lVar9);
        }
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x78);
      uVar7 = special_filetype_flags(this);
      pvVar2 = sp_;
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_INT;
      (pvVar2->val).obj = uVar7 | uVar11;
      if (G_predef_X.file_info == 0) {
        uVar8 = CVmObjList::create_from_stack((uchar **)0x0,7);
      }
      else {
        (**(code **)(*(long *)&G_obj_table_X.pages_[G_predef_X.file_info >> 0xc]
                               [G_predef_X.file_info & 0xfff].ptr_ + 0x18))
                  (G_obj_table_X.pages_[G_predef_X.file_info >> 0xc] +
                   (G_predef_X.file_info & 0xfff),G_predef_X.file_info,0,7);
        uVar8 = r0_.val.obj;
        if (r0_.typ != VM_OBJ) {
          err_throw(0x7da);
        }
      }
      retval->typ = VM_OBJ;
      (retval->val).obj = uVar8;
    }
    else {
      retval->typ = VM_NIL;
    }
    sp_ = sp_ + -(long)(int)uVar10;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getFileInfo(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the GETINFO access mode */
    vm_rcdesc rc(vmg_ "FileName.getFileInfo",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_GETFILEINFO, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_GETINFO,
        OSFTUNK, "application/octet-stream");

    /* check to see if we're following links (follow them by default) */
    int follow_links = TRUE;
    if (argc >= 1)
    {
        /* 
         *   note that our 'asLink' parameter has the opposite sense from
         *   'follow_links', so invert the parameter value 
         */
        follow_links = G_stk->get(0)->get_logical();
        if (!G_stk->get(0)->is_logical())
            err_throw(VMERR_BAD_VAL_BIF);
    }

    int ok;
    os_file_stat_t stat;
    err_try
    {
        /* get the file type from the netfile object */
        ok = netfile->get_file_stat(vmg_ &stat, follow_links);
    }